

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::Ok> *
wasm::WATParser::makeStructRMW<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,AtomicRMWOp op)

{
  _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
  *p_Var1;
  HeapTypeT type_00;
  undefined1 local_140 [8];
  Result<wasm::MemoryOrder> order1;
  string local_f8 [32];
  undefined1 local_d8 [8];
  Result<unsigned_int> _val_3;
  Result<wasm::MemoryOrder> order2;
  Result<unsigned_int> field;
  undefined1 local_58 [8];
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> type;
  
  memorder<wasm::WATParser::ParseDefsCtx>((Result<wasm::MemoryOrder> *)local_140,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err> *)
             ((long)&_val_3.val.super__Variant_base<unsigned_int,_wasm::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::Err>.
                     super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                     super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),
             (_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err> *)local_140);
  if (order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
      super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
      super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
      super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
      super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
      super__Variant_storage_alias<wasm::MemoryOrder,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string
              ((string *)local_58,
               (string *)
               ((long)&_val_3.val.super__Variant_base<unsigned_int,_wasm::Err>.
                       super__Move_assign_alias<unsigned_int,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_58);
    std::__cxx11::string::~string((string *)local_58);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err> *)
                      ((long)&_val_3.val.super__Variant_base<unsigned_int,_wasm::Err>.
                              super__Move_assign_alias<unsigned_int,_wasm::Err>.
                              super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                              super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                              super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
    memorder<wasm::WATParser::ParseDefsCtx>
              ((Result<wasm::MemoryOrder> *)
               ((long)&_val_3.val.super__Variant_base<unsigned_int,_wasm::Err>.
                       super__Move_assign_alias<unsigned_int,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20),ctx);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err> *)local_58,
               (_Copy_ctor_base<false,_wasm::MemoryOrder,_wasm::Err> *)
               ((long)&_val_3.val.super__Variant_base<unsigned_int,_wasm::Err>.
                       super__Move_assign_alias<unsigned_int,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
    if (type.val.
        super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        ._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                         super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20),
                 (string *)local_58);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                         super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                         super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err> *)local_58);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err> *)local_58);
      if (local_140._0_4_ ==
          _val_3.val.super__Variant_base<unsigned_int,_wasm::Err>.
          super__Move_assign_alias<unsigned_int,_wasm::Err>.
          super__Copy_assign_alias<unsigned_int,_wasm::Err>.
          super__Move_ctor_alias<unsigned_int,_wasm::Err>.
          super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
          super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_4_) {
        typeidx<wasm::WATParser::ParseDefsCtx>
                  ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT>
                    *)local_58,ctx);
        std::__detail::__variant::
        _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           *)((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                                     super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20),
                          (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           *)local_58);
        if (field.val.super__Variant_base<unsigned_int,_wasm::Err>.
            super__Move_assign_alias<unsigned_int,_wasm::Err>.
            super__Copy_assign_alias<unsigned_int,_wasm::Err>.
            super__Move_ctor_alias<unsigned_int,_wasm::Err>.
            super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
            super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._24_1_ == '\x01') {
          std::__cxx11::string::string
                    ((string *)local_d8,
                     (string *)
                     ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                             super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                             super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                             super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
          _Variant_storage<1ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_d8);
          std::__cxx11::string::~string((string *)local_d8);
          std::__detail::__variant::
          _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
          ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                               *)((long)&order2.val.
                                         super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                                         super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                         super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                         super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                                         super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20
                                 ));
        }
        else {
          std::__detail::__variant::
          _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
          ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                               *)((long)&order2.val.
                                         super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                                         super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                         super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                         super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                                         super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20
                                 ));
          p_Var1 = (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                    *)0x0;
          if (type.val.
              super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
              .
              super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
              .
              super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
              .
              super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
              .
              super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
              .
              super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
              ._M_u._24_1_ == '\0') {
            p_Var1 = (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                      *)local_58;
          }
          type_00.exactness =
               *(undefined4 *)
                ((long)&(p_Var1->
                        super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                        )._M_u + 8);
          type_00.type.id = (uintptr_t)local_58;
          type_00._12_4_ = 0;
          fieldidx<wasm::WATParser::ParseDefsCtx>
                    ((Result<unsigned_int> *)
                     ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                             super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                             super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                             super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20),ctx,
                     type_00);
          std::__detail::__variant::_Copy_ctor_base<false,_unsigned_int,_wasm::Err>::_Copy_ctor_base
                    ((_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)local_d8,
                     (_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)
                     ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                             super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                             super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                             super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
          if (_val_3.val.super__Variant_base<unsigned_int,_wasm::Err>.
              super__Move_assign_alias<unsigned_int,_wasm::Err>.
              super__Copy_assign_alias<unsigned_int,_wasm::Err>.
              super__Move_ctor_alias<unsigned_int,_wasm::Err>.
              super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
              super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._24_1_ == '\x01') {
            std::__cxx11::string::string(local_f8,(string *)local_d8);
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
            _Variant_storage<1ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_f8
                      );
            std::__cxx11::string::~string(local_f8);
            std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_d8);
          }
          else {
            std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_d8);
            ParseDefsCtx::makeStructRMW
                      (__return_storage_ptr__,ctx,pos,annotations,op,(HeapType)local_58,
                       order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                       super__Variant_storage_alias<wasm::MemoryOrder,_wasm::Err>._32_4_,
                       local_140._0_4_);
          }
          std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::Err> *)
                            ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                                    super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
        }
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                             *)local_58);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   ((long)&order1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20),
                   "struct.atomic.rmw memory orders must be identical",
                   (allocator<char> *)
                   ((long)&order2.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
        Lexer::err((Err *)local_58,&ctx->in,(ulong)pos,
                   (string *)
                   ((long)&order1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_58);
        std::__cxx11::string::~string((string *)local_58);
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&order1.val.super__Variant_base<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_assign_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Move_ctor_alias<wasm::MemoryOrder,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::MemoryOrder,_wasm::Err> + 0x20));
      }
    }
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err> *)
             ((long)&_val_3.val.super__Variant_base<unsigned_int,_wasm::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::Err>.
                     super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                     super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x20));
  std::__detail::__variant::_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::MemoryOrder,_wasm::Err> *)local_140);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeStructRMW(Ctx& ctx,
                       Index pos,
                       const std::vector<Annotation>& annotations,
                       AtomicRMWOp op) {
  auto order1 = memorder(ctx);
  CHECK_ERR(order1);
  auto order2 = memorder(ctx);
  CHECK_ERR(order2);
  if (*order1 != *order2) {
    return ctx.in.err(pos, "struct.atomic.rmw memory orders must be identical");
  }
  auto type = typeidx(ctx);
  CHECK_ERR(type);
  auto field = fieldidx(ctx, *type);
  CHECK_ERR(field);
  return ctx.makeStructRMW(pos, annotations, op, *type, *field, *order1);
}